

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformdatabuilder.cpp
# Opt level: O0

QFormDataPartBuilder __thiscall
QFormDataPartBuilder::setBodyHelper
          (QFormDataPartBuilder *this,QByteArray *data,QAnyStringView name,QAnyStringView mimeType)

{
  QAnyStringView in;
  QFormDataPartBuilder *in_RDI;
  long in_FS_OFFSET;
  QFormDataPartBuilderPrivate *d;
  QString *in_stack_ffffffffffffff58;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  variant<QIODevice_*,_QByteArray> *in_stack_ffffffffffffff70;
  undefined1 local_50 [56];
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFormDataPartBuilder *)0x2ac41f);
  this_00.m_data = local_50;
  QAnyStringView::toString((QAnyStringView *)this_00.m_data);
  QString::operator=((QString *)this_00.m_data,in_stack_ffffffffffffff58);
  QString::~QString((QString *)0x2ac458);
  in.m_size = (size_t)in_RDI;
  in.field_0.m_data = this_00.m_data;
  convertInto((QByteArray *)0x2ac47a,in);
  std::variant<QIODevice*,QByteArray>::operator=(in_stack_ffffffffffffff70,(QByteArray *)in_RDI);
  local_18 = *(undefined4 *)&in_RDI->d;
  uStack_14 = *(undefined4 *)((long)&in_RDI->d + 4);
  uStack_10 = (undefined4)in_RDI->m_index;
  uStack_c = *(undefined4 *)((long)&in_RDI->m_index + 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QFormDataPartBuilder QFormDataPartBuilder::setBodyHelper(const QByteArray &data,
                                                         QAnyStringView name,
                                                         QAnyStringView mimeType)
{
    Q_D(QFormDataPartBuilder);

    d->m_originalBodyName = name.toString();
    convertInto(d->m_mimeType, mimeType);
    d->m_body = data;
    return *this;
}